

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O2

void pleased(aligntyp g_align)

{
  spell *psVar1;
  short sVar2;
  bool bVar3;
  xchar m;
  boolean bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  obj *poVar12;
  obj *poVar13;
  long lVar14;
  char *pcVar15;
  ushort uVar16;
  obj **otmp;
  bool bVar17;
  char repair_buf [256];
  
  iVar6 = in_trouble();
  pcVar10 = align_gname(g_align);
  if (u.ualign.record < 0xe) {
    if (u.ualign.record < 4) {
      if (u.uprops[0x24].extrinsic != 0 || u.uprops[0x23].intrinsic == 0) {
        pcVar15 = "satisfied";
      }
      else {
        if (u.umonnum != u.umonster) {
          bVar4 = dmgtype(youmonst.data,0x24);
          bVar17 = bVar4 == '\0';
          pcVar11 = "full";
          pcVar15 = "satisfied";
          goto LAB_00217f8b;
        }
        pcVar15 = "full";
      }
    }
    else if (u.uprops[0x24].extrinsic != 0 || u.uprops[0x23].intrinsic == 0) {
      pcVar15 = "pleased";
    }
    else if (u.umonnum == u.umonster) {
      pcVar15 = "ticklish";
    }
    else {
      bVar4 = dmgtype(youmonst.data,0x24);
      bVar17 = bVar4 == '\0';
      pcVar11 = "ticklish";
      pcVar15 = "pleased";
LAB_00217f8b:
      if (bVar17) {
        pcVar15 = pcVar11;
      }
    }
  }
  else {
    pcVar15 = "well-pleased";
    if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
      if (u.umonnum != u.umonster) {
        bVar4 = dmgtype(youmonst.data,0x24);
        bVar17 = bVar4 == '\0';
        pcVar11 = "pleased as punch";
        pcVar15 = "well-pleased";
        goto LAB_00217f8b;
      }
      pcVar15 = "pleased as punch";
    }
  }
  pline("You feel that %s is %s.",pcVar10,pcVar15);
  if ((level->locations[u.ux][u.uy].typ == '!') && (p_aligntyp != u.ualign.type)) {
    adjalign(-1);
    return;
  }
  if (iVar6 < 1 && u.ualign.record < 2) {
    adjalign(1);
  }
  if ((iVar6 == 0) && (0xd < u.ualign.record)) {
    if (p_trouble != 0) goto switchD_00218167_caseD_0;
    goto LAB_00218131;
  }
  if (level->locations[u.ux][u.uy].typ == '!') {
    iVar9 = ((*(uint *)&level->locations[u.ux][u.uy].field_0x6 >> 7 & 1) != 0) + 3;
  }
  else {
    iVar9 = 2;
  }
  iVar9 = rn2((int)u.moreluck + (int)u.uluck + iVar9);
  uVar7 = iVar9 + 1;
  uVar8 = 3;
  if (uVar7 < 3) {
    uVar8 = uVar7;
  }
  if (level->locations[u.ux][u.uy].typ == '!') {
    uVar8 = uVar7;
  }
  if (u.ualign.record < 4) {
    if (u.ualign.record < 1) {
      iVar9 = rnl(2);
      uVar8 = (uint)(iVar9 == 0);
    }
    else {
      uVar8 = 1;
    }
  }
  uVar7 = 5;
  if (uVar8 < 5) {
    uVar7 = uVar8;
  }
  switch(uVar7) {
  case 1:
    if (0 < iVar6) {
      fix_worst_trouble(iVar6);
    }
    break;
  case 2:
    while (iVar6 = in_trouble(), 0 < iVar6) {
switchD_002180f8_caseD_3:
      fix_worst_trouble(iVar6);
    }
    break;
  case 3:
    goto switchD_002180f8_caseD_3;
  case 4:
    bVar17 = true;
    goto LAB_00218116;
  case 5:
    bVar17 = false;
LAB_00218116:
    do {
      fix_worst_trouble(iVar6);
      iVar6 = in_trouble();
    } while (iVar6 != 0);
    if (bVar17) break;
LAB_00218131:
    iVar6 = rn2((int)u.uluck + (int)u.moreluck + 6 >> 1);
    switch(iVar6) {
    case 0:
      break;
    case 1:
      if ((uwep == (obj *)0x0) ||
         (((iVar6 = welded(uwep), iVar6 == 0 && (uwep->oclass != '\x02')) &&
          ((uwep->oclass != '\x06' || (objects[uwep->otyp].oc_subtyp == '\0')))))) break;
      repair_buf[0] = '\0';
      uVar8 = *(uint *)&uwep->field_0x4a;
      if ((uVar8 & 0xf00) != 0) {
        pcVar10 = otense(uwep,"are");
        sprintf(repair_buf," and %s now as good as new",pcVar10);
        uVar8 = *(uint *)&uwep->field_0x4a;
      }
      if ((uVar8 & 1) == 0) {
        if ((uVar8 & 2) == 0) {
          bless(uwep);
          poVar12 = uwep;
          *(uint *)&uwep->field_0x4a = *(uint *)&uwep->field_0x4a | 0x40;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002183c7;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002183c2;
LAB_00218cdc:
            pcVar10 = aobjnam(poVar12,"softly glow");
            pcVar15 = hcolor("light blue");
            pcVar15 = an(pcVar15);
            pcVar11 = "Your %s with %s aura%s.";
            goto LAB_00218d06;
          }
LAB_002183c2:
          if (ublindf != (obj *)0x0) {
LAB_002183c7:
            if (ublindf->oartifact == '\x1d') goto LAB_00218cdc;
          }
          pcVar10 = u_gname();
          pcVar15 = xname(uwep);
          pcVar11 = "You feel the blessing of %s over your %s.";
LAB_002187aa:
          pline(pcVar11,pcVar10,pcVar15);
          goto LAB_00218d18;
        }
      }
      else {
        uncurse(uwep);
        poVar12 = uwep;
        *(uint *)&uwep->field_0x4a = *(uint *)&uwep->field_0x4a | 0x40;
        if (u.uprops[0x1e].intrinsic != 0) {
LAB_00218784:
          if (ublindf != (obj *)0x0) {
LAB_00218789:
            if (ublindf->oartifact == '\x1d') goto LAB_00218998;
          }
          pcVar10 = u_gname();
          pcVar15 = xname(uwep);
          pcVar11 = "You feel the power of %s over your %s.";
          goto LAB_002187aa;
        }
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00218789;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00218784;
LAB_00218998:
        pcVar10 = aobjnam(poVar12,"softly glow");
        pcVar15 = hcolor("amber");
        pcVar11 = "Your %s %s%s.";
LAB_00218d06:
        pline(pcVar11,pcVar10,pcVar15,repair_buf);
LAB_00218d18:
        repair_buf[0] = '\0';
      }
      poVar12 = uwep;
      if (((*(uint *)&uwep->field_0x4a & 0xf00) != 0) &&
         (*(uint *)&uwep->field_0x4a = *(uint *)&uwep->field_0x4a & 0xfffff0ff,
         repair_buf[0] != '\0')) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00218d59;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00218d54;
          pcVar10 = "look";
        }
        else {
LAB_00218d54:
          if (ublindf == (obj *)0x0) {
            pcVar10 = "feel";
          }
          else {
LAB_00218d59:
            pcVar10 = "feel";
            if (ublindf->oartifact == '\x1d') {
              pcVar10 = "look";
            }
          }
        }
        pcVar10 = aobjnam(poVar12,pcVar10);
        pline("Your %s as good as new!",pcVar10);
      }
      goto LAB_00218f14;
    case 2:
      goto switchD_00218167_caseD_2;
    case 3:
      if (((ushort)u.uevent._0_2_ >> 8 & 1) == 0) {
        if (((ushort)u.uevent._0_2_ >> 6 & 3) == 1) {
          You_hear("a divine music...");
          pline("It sounds like:  \"%s\".",tune);
        }
        else {
          if (((ushort)u.uevent._0_2_ >> 6 & 3) != 0) goto switchD_00218167_caseD_2;
          godvoice(g_align,(char *)0x0);
          pcVar10 = "creature";
          if ((youmonst.data)->mlet == '5') {
            pcVar10 = "mortal";
          }
          verbalize("Hark, %s!",pcVar10);
          verbalize("To enter the castle, thou must play the right tune!");
        }
        u.uevent._0_2_ = u.uevent._0_2_ & 0xff3f | u.uevent._0_2_ + 0x40 & 0xc0;
        break;
      }
switchD_00218167_caseD_2:
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00218326;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0021831d;
LAB_00218497:
        pcVar10 = hcolor("golden");
        pcVar10 = an(pcVar10);
        pline("You are surrounded by %s glow.",pcVar10);
      }
      else {
LAB_0021831d:
        if (ublindf != (obj *)0x0) {
LAB_00218326:
          if (ublindf->oartifact == '\x1d') goto LAB_00218497;
        }
      }
      if (u.ulevel < u.ulevelmax) {
        u.ulevelmax = u.ulevelmax + -1;
        pluslvl('\0');
LAB_002185ab:
        if (u.umonnum != u.umonster) {
          u.mh = u.mhmax;
        }
      }
      else {
        u.uhpmax = u.uhpmax + 5;
        if (u.umonnum != u.umonster) {
          u.mhmax = u.mhmax + 5;
          goto LAB_002185ab;
        }
      }
      u.acurr.a[0] = u.amax.a[0];
      u.uhp = u.uhpmax;
      if (u.uhunger < 900) {
        init_uhunger();
      }
      if (u.uluck < '\0') {
        u.uluck = '\0';
      }
      make_blinded(0,'\x01');
      iflags.botl = '\x01';
      break;
    case 4:
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0021827d;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00218278;
LAB_00218633:
        pcVar10 = hcolor("light blue");
        pcVar10 = an(pcVar10);
        pcVar15 = "You are surrounded by %s aura.";
      }
      else {
LAB_00218278:
        if (ublindf != (obj *)0x0) {
LAB_0021827d:
          if (ublindf->oartifact == '\x1d') goto LAB_00218633;
        }
        pcVar10 = u_gname();
        pcVar15 = "You feel the power of %s.";
      }
      pline(pcVar15,pcVar10);
      otmp = &invent;
      iVar6 = 0;
LAB_00218670:
      do {
        otmp = &((obj *)otmp)->nobj->nobj;
        if ((obj *)otmp == (obj *)0x0) goto LAB_00218700;
        if ((((obj *)otmp)->field_0x4a & 1) != 0) {
          uncurse((obj *)otmp);
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002186b3;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002186ae;
          }
          else {
LAB_002186ae:
            if (ublindf == (obj *)0x0) goto LAB_00218670;
LAB_002186b3:
            if (ublindf->oartifact != '\x1d') goto LAB_00218670;
          }
          pcVar10 = aobjnam((obj *)otmp,"softly glow");
          pcVar15 = hcolor("amber");
          pline("Your %s %s.",pcVar10,pcVar15);
          ((obj *)otmp)->field_0x4a = ((obj *)otmp)->field_0x4a | 0x40;
          iVar6 = iVar6 + 1;
        }
      } while( true );
    case 5:
      godvoice(u.ualign.type,"Thou hast pleased me with thy progress,");
      if ((u.uprops[0x19].intrinsic & 0x7000000) == 0) {
        u.uprops[0x19].intrinsic = u.uprops[0x19].intrinsic | 0x4000000;
        pline("\"and thus I grant thee the gift of %s!\"","Telepathy");
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
            if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_002189ee;
            goto LAB_00218747;
          }
LAB_0021874c:
          if (ublindf->oartifact == '\x1d') goto LAB_002189ee;
        }
        else {
LAB_00218747:
          if (ublindf != (obj *)0x0) goto LAB_0021874c;
        }
        see_monsters();
      }
      else {
        if ((u.uprops[0x1a].intrinsic & 0x7000000) == 0) {
          u.uprops[0x1a].intrinsic = u.uprops[0x1a].intrinsic | 0x4000000;
          pcVar10 = "Speed";
        }
        else if ((u.uprops[0x13].intrinsic & 0x7000000) == 0) {
          u.uprops[0x13].intrinsic = u.uprops[0x13].intrinsic | 0x4000000;
          pcVar10 = "Stealth";
        }
        else {
          if ((u.uprops[0x16].intrinsic & 0x7000000) == 0) {
            u.uprops[0x16].intrinsic = u.uprops[0x16].intrinsic | 0x4000000;
            if (u.ublessed == 0) {
              uVar8 = mt_random();
              u.ublessed = uVar8 % 3 + 2;
            }
          }
          else {
            u.ublessed = u.ublessed + 1;
          }
          pcVar10 = "my protection";
        }
        pline("\"and thus I grant thee the gift of %s!\"",pcVar10);
      }
LAB_002189ee:
      verbalize("Use it wisely in my name!");
      break;
    case 6:
switchD_00218167_caseD_6:
      iVar6 = u.ulevel + 1;
      at_your_feet("An object");
      poVar12 = mkobj(level,'\n','\x01');
      for (; 1 < iVar6; iVar6 = iVar6 + -1) {
        sVar2 = poVar12->otyp;
        if (sVar2 == 0x1bc) {
          if (((objects[0x1bc].field_0x10 & 1) == 0) ||
             (poVar13 = carrying(0xf7), poVar13 != (obj *)0x0)) break;
        }
        else {
          lVar14 = 0;
          do {
            if (lVar14 == 0x2b) {
              iVar9 = spell_skilltype((int)sVar2);
              if (u.weapon_skills[iVar9].skill != '\0') goto LAB_00218238;
              break;
            }
            psVar1 = spl_book + lVar14;
            lVar14 = lVar14 + 1;
          } while (psVar1->sp_id != sVar2);
        }
        iVar9 = rnd_class(bases[10],0x1bc);
        poVar12->otyp = (short)iVar9;
      }
LAB_00218238:
      bless(poVar12);
      place_object(poVar12,level,(int)u.ux,(int)u.uy);
      break;
    case 7:
    case 8:
    case 9:
      if (((flags.elbereth_enabled == '\0') || (u.ualign.record < 0x14)) ||
         (((uint)u.uevent & 0x1800) != 0)) goto switchD_00218167_caseD_6;
      u.uprops[0xc].intrinsic._3_1_ = u.uprops[0xc].intrinsic._3_1_ | 4;
      u.uprops[1].intrinsic._3_1_ = u.uprops[1].intrinsic._3_1_ | 4;
      u.uprops[2].intrinsic._3_1_ = u.uprops[2].intrinsic._3_1_ | 4;
      u.uprops[5].intrinsic._3_1_ = u.uprops[5].intrinsic._3_1_ | 4;
      u.uprops[3].intrinsic._3_1_ = u.uprops[3].intrinsic._3_1_ | 4;
      u.uprops[6].intrinsic._3_1_ = u.uprops[6].intrinsic._3_1_ | 4;
      godvoice(u.ualign.type,(char *)0x0);
      poVar12 = (obj *)0x0;
      if (((uwep != (obj *)0x0) && (poVar12 = uwep, uwep->oclass != '\x02')) &&
         ((uwep->oclass != '\x06' || (objects[uwep->otyp].oc_subtyp == '\0')))) {
        poVar12 = (obj *)0x0;
      }
      if (u.ualign.type == '\0') {
        u.uevent = (u_event)((uint)u.uevent & 0xffffe7ff | 0x1000);
        if (uwep == (obj *)0x0) {
          bVar17 = false;
        }
        else {
          bVar17 = uwep->oartifact == '\x14';
        }
        pcVar10 = artiname(0x14);
        cVar5 = exist_artifact(0x26,pcVar10);
        verbalize("Thou shalt be my Envoy of Balance!");
        historic_event('\0',"were named as the Envoy of Balance!");
      }
      else if (u.ualign.type == -1) {
        u.uevent = (u_event)((uint)u.uevent | 0x1800);
        if (uwep == (obj *)0x0) {
          bVar17 = false;
        }
        else {
          bVar17 = uwep->oartifact == '\x03';
        }
        pcVar10 = artiname(3);
        cVar5 = exist_artifact(0x2a,pcVar10);
        pcVar10 = "take lives";
        if (bVar17) {
          pcVar10 = "steal souls";
        }
        if (cVar5 == '\0') {
          pcVar10 = "steal souls";
        }
        verbalize("Thou art chosen to %s for My Glory!",pcVar10);
        historic_event('\0',"were chosen to %s for your god\'s glory!",pcVar10);
      }
      else {
        if (u.ualign.type == '\x01') {
          u.uevent = (u_event)((uint)u.uevent & 0xffffe7ff | 0x800);
          verbalize("I crown thee...  The Hand of Elbereth!");
          historic_event('\0',"were crowned as the Hand of Elbereth!");
        }
        cVar5 = '\0';
        bVar17 = false;
      }
      if (urole.malenum == 0x168) {
        if (uwep == (obj *)0x0) {
LAB_00218acf:
          poVar13 = carrying(0x182);
          if (poVar13 != (obj *)0x0) goto LAB_00218ae6;
          uVar16 = 0x182;
          goto LAB_00218b29;
        }
        bVar3 = true;
        if ((uwep->oartifact != '\x03') && (uwep->oartifact != '\x14')) goto LAB_00218acf;
      }
      else {
LAB_00218ae6:
        bVar3 = true;
        if ((urole.malenum == 0x160) &&
           (((uwep == (obj *)0x0 || (uwep->oartifact == '\0')) &&
            (poVar13 = carrying(0x197), poVar13 == (obj *)0x0)))) {
          uVar16 = 0x197;
LAB_00218b29:
          poVar12 = mksobj(level,(uint)uVar16,'\x01','\0');
          bless(poVar12);
          poVar12->field_0x4a = poVar12->field_0x4a | 0x40;
          at_your_feet("A spellbook");
          dropy(poVar12);
          u.ugifts = u.ugifts + 1;
          lVar14 = 0;
          do {
            if (lVar14 == 0x2b) goto LAB_00218bc6;
            psVar1 = spl_book + lVar14;
            lVar14 = lVar14 + 1;
          } while (psVar1->sp_id != uVar16);
          if ((uwep == (obj *)0x0) ||
             ((uwep->oclass != '\x02' &&
              ((uwep->oclass != '\x06' || (objects[uwep->otyp].oc_subtyp == '\0')))))) {
LAB_00218bc6:
            bVar3 = false;
          }
          else {
            bVar3 = false;
            poVar12 = uwep;
          }
        }
      }
      if (u.ualign.type == '\0') {
        if (bVar3) {
          if (bVar17) {
            pcVar10 = xname(poVar12);
            pline("Your %s goes snicker-snack!",pcVar10);
            poVar12->field_0x4a = poVar12->field_0x4a | 0x20;
          }
          else if (cVar5 == '\0') {
            poVar12 = mksobj(level,0x26,'\0','\0');
            pcVar10 = artiname(0x14);
            poVar12 = oname(poVar12,pcVar10);
            poVar12->spe = '\x01';
            at_your_feet("A sword");
            dropy(poVar12);
            u.ugifts = u.ugifts + 1;
          }
        }
        unrestrict_weapon_skill(7);
        if (poVar12 == (obj *)0x0) goto LAB_00218f01;
        if (poVar12->oartifact != '\x14') goto LAB_00218ea6;
        m = '\x14';
LAB_00218ea0:
        discover_artifact(m);
LAB_00218ea6:
        if ((poVar12->oclass != '\x02') &&
           ((poVar12->oclass != '\x06' || (objects[poVar12->otyp].oc_subtyp == '\0'))))
        goto LAB_00218f01;
        bless(poVar12);
        *(uint *)&poVar12->field_0x4a = *(uint *)&poVar12->field_0x4a & 0xffffe03f | 0x10c0;
        if (poVar12->spe < '\x01') {
          poVar12->spe = '\x01';
        }
        iVar6 = weapon_type(poVar12);
        unrestrict_weapon_skill(iVar6);
      }
      else {
        if (u.ualign.type == -1) {
          pcVar10 = hcolor("black");
          sprintf(repair_buf,"%s sword",pcVar10);
          if (bVar3) {
            if (bVar17) {
              pline("Your %s hums ominously!",repair_buf);
              poVar12->field_0x4a = poVar12->field_0x4a | 0x20;
            }
            else if (cVar5 == '\0') {
              poVar12 = mksobj(level,0x2a,'\0','\0');
              pcVar10 = artiname(3);
              poVar12 = oname(poVar12,pcVar10);
              pcVar10 = An(repair_buf);
              at_your_feet(pcVar10);
              poVar12->spe = '\x01';
              dropy(poVar12);
              u.ugifts = u.ugifts + 1;
            }
          }
          unrestrict_weapon_skill(6);
          if (poVar12 != (obj *)0x0) {
            if (poVar12->oartifact == '\x03') {
              m = '\x03';
              goto LAB_00218ea0;
            }
            goto LAB_00218ea6;
          }
        }
        else if (u.ualign.type == '\x01') {
          if (((!(bool)(bVar3 ^ 1) && poVar12 != (obj *)0x0) && (poVar12->otyp == 0x26)) &&
             (poVar12->oartifact == '\0')) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00218f37;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00218f32;
LAB_00218f5d:
              pline("Your sword shines brightly for a moment.");
            }
            else {
LAB_00218f32:
              if (ublindf != (obj *)0x0) {
LAB_00218f37:
                if (ublindf->oartifact == '\x1d') goto LAB_00218f5d;
              }
            }
            pcVar10 = artiname(1);
            poVar12 = oname(poVar12,pcVar10);
            if (poVar12 == (obj *)0x0) {
              poVar12 = (obj *)0x0;
            }
            else if (poVar12->oartifact == '\x01') {
              u.ugifts = u.ugifts + 1;
            }
          }
          unrestrict_weapon_skill(7);
          if (poVar12 != (obj *)0x0) {
            if (poVar12->oartifact == '\x01') {
              m = '\x01';
              goto LAB_00218ea0;
            }
            goto LAB_00218ea6;
          }
        }
LAB_00218f01:
        if (bVar3) {
          pline("You feel unworthy.");
        }
      }
LAB_00218f14:
      update_inventory();
      break;
    default:
      warning("Confused deity!");
    }
  }
switchD_00218167_caseD_0:
  u.ublesscnt = rnz(0x15e);
  iVar6 = (uint)(((uint)u.uevent & 0x1800) != 0 && flags.elbereth_enabled != '\0') +
          (uint)(((ushort)u.uevent._0_2_ >> 0xd & 1) != 0);
  if (iVar6 != 0) {
    iVar9 = rnz(1000);
    u.ublesscnt = u.ublesscnt + iVar9 * iVar6;
  }
  return;
LAB_00218700:
  if (iVar6 == 0) goto switchD_00218167_caseD_0;
  goto LAB_00218f14;
}

Assistant:

static void pleased(aligntyp g_align)
{
	/* don't use p_trouble, worst trouble may get fixed while praying */
	int trouble = in_trouble();	/* what's your worst difficulty? */
	int pat_on_head = 0, kick_on_butt;

	pline("You feel that %s is %s.", align_gname(g_align),
	    u.ualign.record >= DEVOUT ?
	    Hallucination ? "pleased as punch" : "well-pleased" :
	    u.ualign.record >= STRIDENT ?
	    Hallucination ? "ticklish" : "pleased" :
	    Hallucination ? "full" : "satisfied");

	/* not your deity */
	if (on_altar() && p_aligntyp != u.ualign.type) {
		adjalign(-1);
		return;
	} else if (u.ualign.record < 2 && trouble <= 0) adjalign(1);

	/* depending on your luck & align level, the god you prayed to will:
	   - fix your worst problem if it's major.
	   - fix all your major problems.
	   - fix your worst problem if it's minor.
	   - fix all of your problems.
	   - do you a gratuitous favor.

	   if you make it to the the last category, you roll randomly again
	   to see what they do for you.

	   If your luck is at least 0, then you are guaranteed rescued
	   from your worst major problem. */

	if (!trouble && u.ualign.record >= DEVOUT) {
	    /* if hero was in trouble, but got better, no special favor */
	    if (p_trouble == 0) pat_on_head = 1;
	} else {
	    int action = rn1(Luck + (on_altar() ? 3 + on_shrine() : 2), 1);

	    if (!on_altar()) action = min(action, 3);
	    if (u.ualign.record < STRIDENT)
		action = (u.ualign.record > 0 || !rnl(2)) ? 1 : 0;

	    switch(min(action,5)) {
	    case 5: pat_on_head = 1;
	    case 4: do fix_worst_trouble(trouble);
		    while ((trouble = in_trouble()) != 0);
		    break;

	    case 3: fix_worst_trouble(trouble);
	    case 2: while ((trouble = in_trouble()) > 0)
		    fix_worst_trouble(trouble);
		    break;

	    case 1: if (trouble > 0) fix_worst_trouble(trouble);
	    case 0: break; /* your god blows you off, too bad */
	    }
	}

    /* note: can't get pat_on_head unless all troubles have just been
       fixed or there were no troubles to begin with; hallucination
       won't be in effect so special handling for it is superfluous */
    if (pat_on_head)
	switch(rn2((Luck + 6)>>1)) {
	case 0:	break;
	case 1:
	    if (uwep && (welded(uwep) || uwep->oclass == WEAPON_CLASS ||
			 is_weptool(uwep))) {
		char repair_buf[BUFSZ];

		*repair_buf = '\0';
		if (uwep->oeroded || uwep->oeroded2)
		    sprintf(repair_buf, " and %s now as good as new",
			    otense(uwep, "are"));

		if (uwep->cursed) {
		    uncurse(uwep);
		    uwep->bknown = TRUE;
		    if (!Blind)
			pline("Your %s %s%s.", aobjnam(uwep, "softly glow"),
			     hcolor("amber"), repair_buf);
		    else pline("You feel the power of %s over your %s.",
			u_gname(), xname(uwep));
		    *repair_buf = '\0';
		} else if (!uwep->blessed) {
		    bless(uwep);
		    uwep->bknown = TRUE;
		    if (!Blind)
			pline("Your %s with %s aura%s.",
			     aobjnam(uwep, "softly glow"),
			     an(hcolor("light blue")), repair_buf);
		    else pline("You feel the blessing of %s over your %s.",
			u_gname(), xname(uwep));
		    *repair_buf = '\0';
		}

		/* fix any rust/burn/rot damage, but don't protect
		   against future damage */
		if (uwep->oeroded || uwep->oeroded2) {
		    uwep->oeroded = uwep->oeroded2 = 0;
		    /* only give this message if we didn't just bless
		       or uncurse (which has already given a message) */
		    if (*repair_buf)
			pline("Your %s as good as new!",
			     aobjnam(uwep, Blind ? "feel" : "look"));
		}
		update_inventory();
	    }
	    break;
	case 3:
	    /* takes 2 hints to get the music to enter the stronghold */
	    if (!u.uevent.uopened_dbridge) {
		if (u.uevent.uheard_tune < 1) {
		    godvoice(g_align,NULL);
		    verbalize("Hark, %s!",
			  youmonst.data->mlet == S_HUMAN ? "mortal" : "creature");
		    verbalize(
			"To enter the castle, thou must play the right tune!");
		    u.uevent.uheard_tune++;
		    break;
		} else if (u.uevent.uheard_tune < 2) {
		    You_hear("a divine music...");
		    pline("It sounds like:  \"%s\".", tune);
		    u.uevent.uheard_tune++;
		    break;
		}
	    }
	    /* Otherwise, falls into next case */
	case 2:
	    if (!Blind)
		pline("You are surrounded by %s glow.", an(hcolor("golden")));
	    /* if any levels have been lost (and not yet regained),
	       treat this effect like blessed full healing */
	    if (u.ulevel < u.ulevelmax) {
		u.ulevelmax -= 1;	/* see potion.c */
		pluslvl(FALSE);
	    } else {
		u.uhpmax += 5;
		if (Upolyd) u.mhmax += 5;
	    }
	    u.uhp = u.uhpmax;
	    if (Upolyd) u.mh = u.mhmax;
	    ABASE(A_STR) = AMAX(A_STR);
	    if (u.uhunger < 900) init_uhunger();
	    if (u.uluck < 0) u.uluck = 0;
	    make_blinded(0L,TRUE);
	    iflags.botl = 1;
	    break;
	case 4: {
	    struct obj *otmp;
	    int any = 0;

	    if (Blind)
		pline("You feel the power of %s.", u_gname());
	    else pline("You are surrounded by %s aura.",
		     an(hcolor("light blue")));
	    for (otmp=invent; otmp; otmp=otmp->nobj) {
		if (otmp->cursed) {
		    uncurse(otmp);
		    if (!Blind) {
			pline("Your %s %s.", aobjnam(otmp, "softly glow"),
			     hcolor("amber"));
			otmp->bknown = TRUE;
			++any;
		    }
		}
	    }
	    if (any) update_inventory();
	    break;
	}
	case 5: {
	    const char *msg="\"and thus I grant thee the gift of %s!\"";
	    godvoice(u.ualign.type, "Thou hast pleased me with thy progress,");
	    if (!(HTelepat & INTRINSIC))  {
		HTelepat |= FROMOUTSIDE;
		pline(msg, "Telepathy");
		if (Blind) see_monsters();
	    } else if (!(HFast & INTRINSIC))  {
		HFast |= FROMOUTSIDE;
		pline(msg, "Speed");
	    } else if (!(HStealth & INTRINSIC))  {
		HStealth |= FROMOUTSIDE;
		pline(msg, "Stealth");
	    } else {
		if (!(HProtection & INTRINSIC))  {
		    HProtection |= FROMOUTSIDE;
		    if (!u.ublessed)  u.ublessed = rn1(3, 2);
		} else u.ublessed++;
		pline(msg, "my protection");
	    }
	    verbalize("Use it wisely in my name!");
	    break;
	}
	case 7:
	case 8:
	case 9:		/* KMH -- can occur during full moons */
	    if (flags.elbereth_enabled)
		if (u.ualign.record >= PIOUS && !u.uevent.uhand_of_elbereth) {
		    gcrownu();
		    break;
		} /* else FALLTHRU */
	case 6:	{
	    struct obj *otmp;
	    int sp_no, trycnt = u.ulevel + 1;

	    at_your_feet("An object");
	    /* not yet known spells given preference over already known ones */
	    /* Also, try to grant a spell for which there is a skill slot */
	    otmp = mkobj(level, SPBOOK_CLASS, TRUE);
	    while (--trycnt > 0) {
		if (otmp->otyp != SPE_BLANK_PAPER) {
		    for (sp_no = 0; sp_no < MAXSPELL; sp_no++)
			if (spl_book[sp_no].sp_id == otmp->otyp) break;
		    if (sp_no == MAXSPELL &&
			!P_RESTRICTED(spell_skilltype(otmp->otyp)))
			break;	/* usable, but not yet known */
		} else {
		    if (!objects[SPE_BLANK_PAPER].oc_name_known ||
			    carrying(MAGIC_MARKER)) break;
		}
		otmp->otyp = rnd_class(bases[SPBOOK_CLASS], SPE_BLANK_PAPER);
	    }
	    bless(otmp);
	    place_object(otmp, level, u.ux, u.uy);
	    break;
	}
	default:	warning("Confused deity!");
	    break;
	}

	u.ublesscnt = rnz(350);
	kick_on_butt = u.uevent.udemigod ? 1 : 0;

	if (flags.elbereth_enabled && u.uevent.uhand_of_elbereth)
	    kick_on_butt++;

	if (kick_on_butt)
	    u.ublesscnt += kick_on_butt * rnz(1000);

	return;
}